

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

bool __thiscall cfd::core::DescriptorScriptReference::HasAddress(DescriptorScriptReference *this)

{
  bool bVar1;
  Script *this_00;
  
  if (this->script_type_ == kDescriptorScriptRaw) {
    this_00 = &this->locking_script_;
    bVar1 = Script::IsP2wpkhScript(this_00);
    if (!bVar1) {
      bVar1 = Script::IsP2wshScript(this_00);
      if (!bVar1) {
        bVar1 = Script::IsTaprootScript(this_00);
        if (!bVar1) {
          bVar1 = Script::IsP2shScript(this_00);
          if (!bVar1) {
            bVar1 = Script::IsP2pkhScript(this_00);
            return bVar1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool DescriptorScriptReference::HasAddress() const {
  if (script_type_ == DescriptorScriptType::kDescriptorScriptRaw) {
    if (locking_script_.IsP2wpkhScript() || locking_script_.IsP2wshScript() ||
        locking_script_.IsTaprootScript() || locking_script_.IsP2shScript() ||
        locking_script_.IsP2pkhScript()) {
      return true;
    }
    return false;
  }
  return true;
}